

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitSwitch(PrintExpressionContents *this,Switch *curr)

{
  ostream *o;
  bool bVar1;
  ArenaVector<wasm::Name> *this_00;
  Name *this_01;
  Name *t;
  Iterator __end2;
  Iterator __begin2;
  ArenaVector<wasm::Name> *__range2;
  Switch *local_18;
  Switch *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (Switch *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"br_table");
  printMedium(o,___range2);
  this_00 = &local_18->targets;
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::begin
                 (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  _t = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::end
                 (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator!=
                      ((Iterator *)&__end2.index,(Iterator *)&t);
    if (!bVar1) break;
    this_01 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                        ((Iterator *)&__end2.index);
    std::operator<<(this->o,' ');
    wasm::Name::print(this_01,this->o);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  std::operator<<(this->o,' ');
  wasm::Name::print(&local_18->default_,this->o);
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
    printMedium(o, "br_table");
    for (auto& t : curr->targets) {
      o << ' ';
      t.print(o);
    }
    o << ' ';
    curr->default_.print(o);
  }